

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructWithHandlerVector_Test::TestBody
          (Engine_testConstructWithHandlerVector_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar2;
  pointer pHVar3;
  AssertHelper *this_00;
  void **val1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Engine e;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  handlers;
  value_type *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  unique_ptr<PrintHandler,_std::default_delete<PrintHandler>_> *in_stack_fffffffffffffe48;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int iVar4;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  Type in_stack_fffffffffffffe6c;
  Type type;
  Engine *in_stack_fffffffffffffe70;
  Message *message;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_120 [2];
  AssertHelper *local_100;
  undefined8 local_f8;
  AssertionResult local_f0 [2];
  size_type local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  uint local_ac;
  AssertionResult local_98;
  Engine local_88;
  Message local_28 [5];
  
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            *)0x1163ac);
  std::make_unique<PrintHandler>();
  message = local_28;
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<PrintHandler,std::default_delete<PrintHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
              in_stack_fffffffffffffe38);
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffe50);
  std::unique_ptr<PrintHandler,_std::default_delete<PrintHandler>_>::~unique_ptr
            ((unique_ptr<PrintHandler,_std::default_delete<PrintHandler>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  std::make_unique<TestHandler>();
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffe50,
             (unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)in_stack_fffffffffffffe48
            );
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
              in_stack_fffffffffffffe38);
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffe50);
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  Engine::Engine(in_stack_fffffffffffffe70,
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
             (char (*) [4])in_stack_fffffffffffffe48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    testing::AssertionResult::failure_message((AssertionResult *)0x11659c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
               (char *)in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffec0,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    testing::Message::~Message((Message *)0x1165f9);
  }
  local_ac = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116667);
  if (local_ac == 0) {
    local_c4 = 2;
    pvVar2 = Engine::GetHandlers(&local_88);
    local_d0 = std::
               vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               ::size(pvVar2);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
               (int *)in_stack_fffffffffffffe48,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe70);
      testing::AssertionResult::failure_message((AssertionResult *)0x11673f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                 (char *)in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (char *)in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffec0,message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      testing::Message::~Message((Message *)0x11679c);
    }
    local_ac = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11680a);
    if (local_ac == 0) {
      local_f8 = 0;
      pvVar2 = Engine::GetHandlers(&local_88);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::operator[](pvVar2,0);
      pHVar3 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                         ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                          CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      if (pHVar3 == (pointer)0x0) {
        this_00 = (AssertHelper *)0x0;
      }
      else {
        this_00 = (AssertHelper *)
                  __dynamic_cast(pHVar3,&Handler::typeinfo,&PrintHandler::typeinfo,0);
      }
      local_100 = this_00;
      testing::internal::CmpHelperNE<decltype(nullptr),PrintHandler*>
                (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                 (void **)in_stack_fffffffffffffe48,
                 (PrintHandler **)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      iVar4 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
      type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe6c);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffe60 =
             (vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0x11692b);
        testing::internal::AssertHelper::AssertHelper
                  (this_00,type,(char *)in_stack_fffffffffffffe60,iVar4,
                   (char *)in_stack_fffffffffffffe50);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffec0,message);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        testing::Message::~Message((Message *)0x116988);
      }
      local_ac = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1169f6);
      if (local_ac == 0) {
        pvVar2 = Engine::GetHandlers(&local_88);
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::operator[](pvVar2,1);
        in_stack_fffffffffffffe50 =
             (vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              *)std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                          ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                           CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        if (in_stack_fffffffffffffe50 ==
            (vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             *)0x0) {
          val1 = (void **)0x0;
        }
        else {
          val1 = (void **)__dynamic_cast(in_stack_fffffffffffffe50,&Handler::typeinfo,
                                         &TestHandler::typeinfo,0);
        }
        testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                  ((char *)pvVar2,(char *)in_stack_fffffffffffffe50,val1,
                   (TestHandler **)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        iVar4 = (int)((ulong)pvVar2 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
        in_stack_fffffffffffffe47 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)this_00);
          testing::AssertionResult::failure_message((AssertionResult *)0x116b18);
          testing::internal::AssertHelper::AssertHelper
                    (this_00,type,(char *)in_stack_fffffffffffffe60,iVar4,
                     (char *)in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffffec0,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
          testing::Message::~Message((Message *)0x116b73);
        }
        local_ac = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x116bde);
        if (local_ac == 0) {
          local_ac = 0;
        }
      }
    }
  }
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::~vector(in_stack_fffffffffffffe50);
  return;
}

Assistant:

TEST(Engine, testConstructWithHandlerVector) {
    std::vector<std::unique_ptr<Handler>> handlers;
    handlers.push_back(std::make_unique<PrintHandler>());
    handlers.push_back(std::make_unique<TestHandler>());
    Engine e("foo", handlers);
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(2, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get()));
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e.GetHandlers()[1].get()));
}